

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O2

void __thiscall pybind11::weakref::weakref(weakref *this,handle obj,handle callback)

{
  PyObject *pPVar1;
  long lVar2;
  error_already_set *this_00;
  
  pPVar1 = (PyObject *)PyWeakref_NewRef(obj.m_ptr,callback.m_ptr);
  (this->super_object).super_handle.m_ptr = pPVar1;
  if (pPVar1 != (PyObject *)0x0) {
    return;
  }
  lVar2 = PyErr_Occurred();
  if (lVar2 == 0) {
    pybind11_fail("Could not allocate weak reference!");
  }
  this_00 = (error_already_set *)__cxa_allocate_exception(0x18);
  error_already_set::error_already_set(this_00);
  __cxa_throw(this_00,&error_already_set::typeinfo,error_already_set::~error_already_set);
}

Assistant:

explicit weakref(handle obj, handle callback = {})
        : object(PyWeakref_NewRef(obj.ptr(), callback.ptr()), stolen_t{}) {
        if (!m_ptr) {
            if (PyErr_Occurred()) {
                throw error_already_set();
            }
            pybind11_fail("Could not allocate weak reference!");
        }
    }